

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O2

void serialization::
     serialize_unpack<char_const*const*&,serialization::json_oarchive,std::__cxx11::string_const&>
               (char ***arg,json_oarchive *ar,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *front)

{
  json_oarchive::save_key_start(ar,**arg);
  json_oarchive::save(ar,front);
  *arg = *arg + 1;
  return;
}

Assistant:

inline void serialize_unpack(Argument && arg, Archive & ar, T && front, Args && ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.save_key_start(key);
    serialize_helper(ar, front);
    ar.save_key_end(key);

    serialize_unpack(++arg, ar, std::forward<Args>(next)...);
}